

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.cpp
# Opt level: O2

error arc::builtin_dir_exists(vector<arc::atom,_std::allocator<arc::atom>_> *vargs,atom *result)

{
  atom *paVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__source;
  error eVar3;
  path pStack_88;
  atom a;
  path local_40;
  
  paVar1 = (vargs->super__Vector_base<arc::atom,_std::allocator<arc::atom>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(vargs->super__Vector_base<arc::atom,_std::allocator<arc::atom>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)paVar1 == 0x20) {
    atom::atom(&a,paVar1);
    if (a.type == T_STRING) {
      __source = atom::asp<std::__cxx11::string>(&a);
      if (__source->_M_string_length == 0) {
        eVar3 = ERROR_FILE;
      }
      else {
        atom::operator=(result,(atom *)nil);
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  (&pStack_88,__source,auto_format);
        bVar2 = std::filesystem::exists(&pStack_88);
        if (bVar2) {
          std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                    (&local_40,__source,auto_format);
          bVar2 = std::filesystem::is_directory(&local_40);
          std::filesystem::__cxx11::path::~path(&local_40);
          std::filesystem::__cxx11::path::~path(&pStack_88);
          eVar3 = ERROR_OK;
          if (bVar2) {
            atom::operator=(result,(atom *)sym_t);
          }
        }
        else {
          std::filesystem::__cxx11::path::~path(&pStack_88);
          eVar3 = ERROR_OK;
        }
      }
    }
    else {
      eVar3 = ERROR_TYPE;
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                         *)&a.val);
  }
  else {
    eVar3 = ERROR_ARGS;
  }
  return eVar3;
}

Assistant:

error builtin_dir_exists(const vector<atom>& vargs, atom* result) {
		if (vargs.size() != 1) return ERROR_ARGS;
		atom a = vargs[0];
		if (a.type != T_STRING) return ERROR_TYPE;
		const string& path = a.asp<string>();
		if (path.length() == 0) return ERROR_FILE;

		*result = nil;
		if (filesystem::exists(path) && filesystem::is_directory(path)) {
			*result = sym_t;
		}
		return ERROR_OK;
	}